

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O2

Tape * __thiscall
njoy::ENDFtk::tree::Tape::parse(Tape *__return_storage_ptr__,Tape *this,long *lineNumber)

{
  iterator end;
  iterator position;
  string content;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  string local_38;
  
  content_abi_cxx11_(&local_38,this);
  local_40._M_current = local_38._M_dataplus._M_p;
  local_48._M_current = local_38._M_dataplus._M_p + local_38._M_string_length;
  ENDFtk::Tape::Tape<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (__return_storage_ptr__,&local_40,&local_48,lineNumber);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

::njoy::ENDFtk::Tape parse( long& lineNumber ) const {

  std::string content = this->content();
  auto position = content.begin();
  auto end = content.end();

  return { position, end, lineNumber };
}